

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

void __thiscall Json::Exception::~Exception(Exception *this)

{
  *(undefined ***)this = &PTR__Exception_008ad1b8;
  std::__cxx11::string::~string((string *)&this->msg_);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

Exception::~Exception() noexcept = default;